

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int add_matching_tests_to_suite
              (void *handle,char *symbolic_name_pattern,CgreenVector *tests,TestSuite *suite,
              ContextSuite **context_suites)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  TestItem *pTVar4;
  long lVar5;
  TestItem *in_RCX;
  undefined8 in_RDX;
  TestSuite *in_RSI;
  undefined8 in_RDI;
  ContextSuite **in_R8;
  CgreenTest *test_function;
  char *specification_name;
  char *error;
  int i;
  int count;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  TestItem *in_stack_ffffffffffffff90;
  ContextSuite **context_suites_00;
  TestSuite *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar6;
  char *in_stack_ffffffffffffffb0;
  int local_38;
  int local_34;
  
  local_34 = 0;
  local_38 = 0;
  do {
    iVar6 = local_38;
    iVar3 = cgreen_vector_size(in_RDX);
    if (iVar3 <= iVar6) {
      return local_34;
    }
    if (in_RSI == (TestSuite *)0x0) {
LAB_00104733:
      pTVar4 = get_item_from((CgreenVector *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pcVar1 = pTVar4->specification_name;
      in_stack_ffffffffffffffb0 = (char *)dlsym(in_RDI,pcVar1);
      lVar5 = dlerror();
      if (lVar5 != 0) {
        panic("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tools/runner.c"
              ,0x98,"Could not find specification_name symbol \'%s\'",pcVar1);
      }
      in_stack_ffffffffffffff90 = in_RCX;
      context_suites_00 = in_R8;
      get_item_from((CgreenVector *)in_RCX,in_stack_ffffffffffffff8c);
      add_test_to_context(in_stack_ffffffffffffffa0,context_suites_00,in_stack_ffffffffffffff90,
                          (CgreenTest *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_34 = local_34 + 1;
    }
    else {
      in_stack_ffffffffffffffa0 = in_RSI;
      get_item_from((CgreenVector *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      _Var2 = test_matches_pattern
                        (in_stack_ffffffffffffffb0,
                         (TestItem *)CONCAT44(iVar6,in_stack_ffffffffffffffa8));
      if (_Var2) goto LAB_00104733;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static int add_matching_tests_to_suite(void *handle,
                                       const char *symbolic_name_pattern,
                                       CgreenVector *tests, TestSuite *suite,
                                       ContextSuite **context_suites)
{
    int count = 0;

    for (int i = 0; i<cgreen_vector_size(tests); i++) {
        if (symbolic_name_pattern == NULL || test_matches_pattern(symbolic_name_pattern,
                                                                  get_item_from(tests, i))) {
            char *error;
            const char *specification_name = get_item_from(tests, i)->specification_name;
            CgreenTest *test_function = (CgreenTest *)(dlsym(handle,
                                                             specification_name));
            if ((error = dlerror()) != NULL)  {
                PANIC("Could not find specification_name symbol '%s'",
                      specification_name);
                return -1;
            }

            add_test_to_context(suite, context_suites, get_item_from(tests, i), test_function);
            count++;
        }
    }

    return count;
}